

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclSharedData.cpp
# Opt level: O2

void __thiscall xmrig::OclSharedData::setRunTime(OclSharedData *this,uint64_t time)

{
  undefined1 auVar1 [16];
  
  std::mutex::lock(&this->m_mutex);
  auVar1._8_4_ = (int)(time >> 0x20);
  auVar1._0_8_ = time;
  auVar1._12_4_ = 0x45300000;
  this->m_averageRunTime =
       ((auVar1._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)time) - 4503599627370496.0)) * 0.1 +
       this->m_averageRunTime * 0.9;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void xmrig::OclSharedData::setRunTime(uint64_t time)
{
    // averagingBias = 1.0 - only the last delta time is taken into account
    // averagingBias = 0.5 - the last delta time has the same weight as all the previous ones combined
    // averagingBias = 0.1 - the last delta time has 10% weight of all the previous ones combined
    constexpr double averagingBias = 0.1;

    std::lock_guard<std::mutex> lock(m_mutex);
    m_averageRunTime = m_averageRunTime * (1.0 - averagingBias) + time * averagingBias;
}